

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json11.cpp
# Opt level: O1

char __thiscall json11::anon_unknown_22::JsonParser::get_next_token(JsonParser *this)

{
  size_type sVar1;
  long *local_30 [2];
  long local_20 [2];
  
  consume_garbage(this);
  if (this->failed == false) {
    sVar1 = this->i;
    if (sVar1 != this->str->_M_string_length) {
      this->i = sVar1 + 1;
      return (this->str->_M_dataplus)._M_p[sVar1];
    }
    local_30[0] = local_20;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_30,"unexpected end of input","")
    ;
    if (this->failed == false) {
      std::__cxx11::string::operator=((string *)this->err,(string *)local_30);
    }
    this->failed = true;
    if (local_30[0] != local_20) {
      operator_delete(local_30[0],local_20[0] + 1);
    }
  }
  return '\0';
}

Assistant:

char get_next_token() {
        consume_garbage();
        if (failed) return static_cast<char>(0);
        if (i == str.size())
            return fail("unexpected end of input", static_cast<char>(0));

        return str[i++];
    }